

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void icetMatrixTranslate(IceTDouble x,IceTDouble y,IceTDouble z,IceTDouble *mat_out)

{
  *mat_out = 1.0;
  mat_out[1] = 0.0;
  mat_out[2] = 0.0;
  mat_out[3] = 0.0;
  mat_out[4] = 0.0;
  mat_out[5] = 1.0;
  mat_out[6] = 0.0;
  mat_out[7] = 0.0;
  mat_out[8] = 0.0;
  mat_out[9] = 0.0;
  mat_out[10] = 1.0;
  mat_out[0xb] = 0.0;
  mat_out[0xc] = x;
  mat_out[0xd] = y;
  mat_out[0xe] = z;
  mat_out[0xf] = 1.0;
  return;
}

Assistant:

ICET_EXPORT void icetMatrixTranslate(IceTDouble x, IceTDouble y, IceTDouble z,
                                     IceTDouble *mat_out)
{
    mat_out[ 0] = 1.0;
    mat_out[ 1] = 0.0;
    mat_out[ 2] = 0.0;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = 0.0;
    mat_out[ 5] = 1.0;
    mat_out[ 6] = 0.0;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = 0.0;
    mat_out[ 9] = 0.0;
    mat_out[10] = 1.0;
    mat_out[11] = 0.0;

    mat_out[12] = x;
    mat_out[13] = y;
    mat_out[14] = z;
    mat_out[15] = 1.0;
}